

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall Catch::RunContext::runTest(RunContext *this,TestCase *testCase)

{
  bool bVar1;
  uint uVar2;
  IStreamingReporter *pIVar3;
  void *pvVar4;
  IContext *pIVar5;
  size_t sVar6;
  IConfig *pIVar7;
  TestCase *in_RDX;
  TestCaseInfo *in_RSI;
  TestCaseInfo *in_RDI;
  bool missingAssertions;
  TestCaseInfo testInfo;
  string redirectedCerr;
  string redirectedCout;
  Totals prevTotals;
  string *in_stack_00000420;
  string *in_stack_00000428;
  RunContext *in_stack_00000430;
  RunContext *in_stack_fffffffffffffce0;
  TestCaseInfo *this_00;
  TestCase *in_stack_fffffffffffffce8;
  undefined2 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf2;
  undefined1 in_stack_fffffffffffffcf3;
  undefined1 in_stack_fffffffffffffcf4;
  undefined1 in_stack_fffffffffffffcf5;
  byte in_stack_fffffffffffffcf6;
  undefined1 in_stack_fffffffffffffcf7;
  byte local_2fa;
  TestCaseInfo *other;
  string *in_stack_fffffffffffffd28;
  Totals *in_stack_fffffffffffffd30;
  TestCaseInfo *in_stack_fffffffffffffd38;
  TestCaseStats *in_stack_fffffffffffffd40;
  undefined8 local_188;
  size_t local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined1 local_158 [224];
  string local_78 [32];
  string local_58 [32];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  TestCase *local_10;
  
  local_38 = *(undefined8 *)&in_RSI[1].className;
  uStack_30 = *(undefined8 *)&in_RSI[1].field_0x28;
  local_28 = *(undefined8 *)&in_RSI[1].field_0x30;
  uStack_20 = *(undefined8 *)&in_RSI[1].field_0x38;
  other = in_RDI;
  local_10 = in_RDX;
  std::__cxx11::string::string(local_58);
  std::__cxx11::string::string(local_78);
  TestCase::getTestCaseInfo(local_10);
  TestCaseInfo::TestCaseInfo(in_RSI,other);
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->
                     ((Ptr<Catch::IStreamingReporter> *)&in_RSI[1].description);
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[8])(pIVar3,local_158);
  pvVar4 = operator_new(0x70);
  RunningTest::RunningTest
            ((RunningTest *)
             CONCAT17(in_stack_fffffffffffffcf7,
                      CONCAT16(in_stack_fffffffffffffcf6,
                               CONCAT15(in_stack_fffffffffffffcf5,
                                        CONCAT14(in_stack_fffffffffffffcf4,
                                                 CONCAT13(in_stack_fffffffffffffcf3,
                                                          CONCAT12(in_stack_fffffffffffffcf2,
                                                                   in_stack_fffffffffffffcf0)))))),
             in_stack_fffffffffffffce8);
  *(void **)&in_RSI->field_0x38 = pvVar4;
  do {
    do {
      runCurrentTest(in_stack_00000430,in_stack_00000428,in_stack_00000420);
      bVar1 = RunningTest::hasUntestedSections
                        ((RunningTest *)
                         CONCAT17(in_stack_fffffffffffffcf7,
                                  CONCAT16(in_stack_fffffffffffffcf6,
                                           CONCAT15(in_stack_fffffffffffffcf5,
                                                    CONCAT14(in_stack_fffffffffffffcf4,
                                                             CONCAT13(in_stack_fffffffffffffcf3,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffcf2,
                                                  in_stack_fffffffffffffcf0)))))));
      local_2fa = 0;
      if (bVar1) {
        bVar1 = aborting(in_stack_fffffffffffffce0);
        local_2fa = bVar1 ^ 0xff;
      }
    } while ((local_2fa & 1) != 0);
    pIVar5 = getCurrentContext();
    uVar2 = (*pIVar5->_vptr_IContext[5])();
    in_stack_fffffffffffffcf7 = (undefined1)uVar2;
    in_stack_fffffffffffffcf6 = 0;
    if ((uVar2 & 1) != 0) {
      in_stack_fffffffffffffcf5 = aborting(in_stack_fffffffffffffce0);
      in_stack_fffffffffffffcf6 = in_stack_fffffffffffffcf5 ^ 0xff;
    }
  } while ((in_stack_fffffffffffffcf6 & 1) != 0);
  Totals::delta((Totals *)
                CONCAT17(in_stack_fffffffffffffcf7,
                         CONCAT16(in_stack_fffffffffffffcf6,
                                  CONCAT15(in_stack_fffffffffffffcf5,
                                           CONCAT14(in_stack_fffffffffffffcf4,
                                                    CONCAT13(in_stack_fffffffffffffcf3,
                                                             CONCAT12(in_stack_fffffffffffffcf2,
                                                                      in_stack_fffffffffffffcf0)))))
                        ),(Totals *)in_stack_fffffffffffffce8);
  sVar6 = Counts::total((Counts *)in_RDI);
  if (sVar6 == 0) {
    pIVar7 = Ptr<const_Catch::IConfig>::operator->
                       ((Ptr<const_Catch::IConfig> *)&in_RSI[1].field_0x18);
    uVar2 = (*(pIVar7->super_IShared).super_NonCopyable._vptr_NonCopyable[9])();
    if ((uVar2 & 1) != 0) {
      *(long *)&in_RSI[1].field_0x28 = *(long *)&in_RSI[1].field_0x28 + 1;
      Totals::delta((Totals *)
                    CONCAT17(in_stack_fffffffffffffcf7,
                             CONCAT16(in_stack_fffffffffffffcf6,
                                      CONCAT15(in_stack_fffffffffffffcf5,
                                               CONCAT14((char)uVar2,
                                                        CONCAT13(in_stack_fffffffffffffcf3,
                                                                 CONCAT12(in_stack_fffffffffffffcf2,
                                                                          in_stack_fffffffffffffcf0)
                                                                ))))),
                    (Totals *)in_stack_fffffffffffffce8);
      *(undefined8 *)in_RDI = local_188;
      *(size_t *)&in_RDI->field_0x8 = local_180;
      *(undefined8 *)&in_RDI->field_0x10 = local_178;
      *(undefined8 *)&in_RDI->field_0x18 = local_170;
    }
  }
  Counts::operator+=((Counts *)&in_RSI[1].field_0x30,(Counts *)&in_RDI->field_0x10);
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->
                     ((Ptr<Catch::IStreamingReporter> *)&in_RSI[1].description);
  aborting(in_stack_fffffffffffffce0);
  TestCaseStats::TestCaseStats
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
             in_stack_fffffffffffffd28,&in_RSI->name,SUB81((ulong)other >> 0x38,0),
             SUB81((ulong)other >> 0x30,0));
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])
            (pIVar3,&stack0xfffffffffffffd28);
  TestCaseStats::~TestCaseStats((TestCaseStats *)in_stack_fffffffffffffce0);
  this_00 = *(TestCaseInfo **)&in_RSI->field_0x38;
  if (this_00 != (TestCaseInfo *)0x0) {
    RunningTest::~RunningTest((RunningTest *)0x1cf1c3);
    operator_delete(this_00);
  }
  *(undefined8 *)&in_RSI->field_0x38 = 0;
  TestCaseInfo::~TestCaseInfo(this_00);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  return (Totals *)other;
}

Assistant:

Totals runTest( TestCase const& testCase ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            TestCaseInfo testInfo = testCase.getTestCaseInfo();

            m_reporter->testCaseStarting( testInfo );

            m_runningTest = new RunningTest( testCase );

            do {
                do {
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( m_runningTest->hasUntestedSections() && !aborting() );
            }
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            Totals deltaTotals = m_totals.delta( prevTotals );
            bool missingAssertions = false;
            if( deltaTotals.assertions.total() == 0  && m_config->warnAboutMissingAssertions() ) {
                m_totals.assertions.failed++;
                deltaTotals = m_totals.delta( prevTotals );
                missingAssertions = true;
            }

            m_totals.testCases += deltaTotals.testCases;

            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        redirectedCout,
                                                        redirectedCerr,
                                                        missingAssertions,
                                                        aborting() ) );

            delete m_runningTest;
            m_runningTest = NULL;

            return deltaTotals;
        }